

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_initialize(REF_CELL ref_cell,REF_CELL_TYPE type)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  REF_INT *pRVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  char *pcVar7;
  ulong uVar8;
  REF_INT RVar9;
  REF_INT RVar10;
  REF_INT RVar11;
  
  ref_cell->type = type;
  ref_cell->last_node_is_an_id = 0;
  RVar6 = 6;
  if (REF_CELL_HE2 < type) {
    return 6;
  }
  uVar8 = (ulong)type;
  iVar1 = *(int *)(&DAT_00221200 + uVar8 * 4);
  ref_cell->last_node_is_an_id = iVar1;
  iVar2 = *(int *)(&DAT_00221240 + uVar8 * 4);
  ref_cell->node_per = iVar2;
  ref_cell->size_per = iVar2 + iVar1;
  uVar3 = *(uint *)(&DAT_002212c0 + uVar8 * 4);
  ref_cell->edge_per = uVar3;
  ref_cell->e2n = (REF_INT *)0x0;
  pRVar4 = (REF_INT *)malloc((ulong)uVar3 << 3);
  ref_cell->e2n = pRVar4;
  if (pRVar4 == (REF_INT *)0x0) {
    pcVar7 = "malloc ref_cell->e2n of REF_INT NULL";
    uVar5 = 0x99;
LAB_00190e32:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar5,
           "ref_cell_initialize",pcVar7);
    return 2;
  }
  switch(uVar8) {
  case 0:
  case 1:
  case 2:
    pRVar4 = ref_cell->e2n;
    pRVar4[0] = 0;
    pRVar4[1] = 1;
    break;
  case 3:
  case 4:
  case 5:
    pRVar4 = ref_cell->e2n;
    pRVar4[0] = 0;
    pRVar4[1] = 1;
    pRVar4[2] = 1;
    pRVar4[3] = 2;
    pRVar4[4] = 2;
    pRVar4[5] = 0;
    break;
  case 6:
  case 7:
    pRVar4 = ref_cell->e2n;
    pRVar4[0] = 0;
    pRVar4[1] = 1;
    pRVar4[2] = 1;
    pRVar4[3] = 2;
    pRVar4[4] = 2;
    pRVar4[5] = 3;
    pRVar4[6] = 3;
    pRVar4[7] = 0;
    break;
  case 8:
  case 0xc:
    pRVar4 = ref_cell->e2n;
    pRVar4[0] = 0;
    pRVar4[1] = 1;
    pRVar4[2] = 0;
    pRVar4[3] = 2;
    pRVar4[4] = 0;
    pRVar4[5] = 3;
    pRVar4[6] = 1;
    pRVar4[7] = 2;
    pRVar4[8] = 1;
    pRVar4[9] = 3;
    pRVar4[10] = 2;
    pRVar4[0xb] = 3;
    break;
  case 9:
  case 0xd:
    pRVar4 = ref_cell->e2n;
    pRVar4[0] = 0;
    pRVar4[1] = 1;
    pRVar4[2] = 0;
    pRVar4[3] = 2;
    pRVar4[4] = 0;
    pRVar4[5] = 3;
    pRVar4[6] = 1;
    pRVar4[7] = 2;
    pRVar4[8] = 1;
    pRVar4[9] = 4;
    pRVar4[10] = 2;
    pRVar4[0xb] = 3;
    pRVar4[0xc] = 2;
    pRVar4[0xd] = 4;
    pRVar4[0xe] = 3;
    pRVar4[0xf] = 4;
    break;
  case 10:
  case 0xe:
    pRVar4 = ref_cell->e2n;
    pRVar4[0] = 0;
    pRVar4[1] = 1;
    pRVar4[2] = 0;
    pRVar4[3] = 2;
    pRVar4[4] = 0;
    pRVar4[5] = 3;
    pRVar4[6] = 1;
    pRVar4[7] = 2;
    pRVar4[8] = 1;
    pRVar4[9] = 4;
    pRVar4[10] = 2;
    pRVar4[0xb] = 5;
    pRVar4[0xc] = 3;
    pRVar4[0xd] = 4;
    pRVar4[0xe] = 3;
    pRVar4[0xf] = 5;
    pRVar4[0x10] = 4;
    pRVar4[0x11] = 5;
    break;
  case 0xb:
  case 0xf:
    pRVar4 = ref_cell->e2n;
    pRVar4[0] = 0;
    pRVar4[1] = 1;
    pRVar4[2] = 0;
    pRVar4[3] = 3;
    pRVar4[4] = 0;
    pRVar4[5] = 4;
    pRVar4[6] = 1;
    pRVar4[7] = 2;
    pRVar4[8] = 1;
    pRVar4[9] = 5;
    pRVar4[10] = 2;
    pRVar4[0xb] = 3;
    pRVar4[0xc] = 2;
    pRVar4[0xd] = 6;
    pRVar4[0xe] = 3;
    pRVar4[0xf] = 7;
    pRVar4[0x10] = 4;
    pRVar4[0x11] = 5;
    pRVar4[0x12] = 4;
    pRVar4[0x13] = 7;
    pRVar4[0x14] = 5;
    pRVar4[0x15] = 6;
    pRVar4[0x16] = 6;
    pRVar4[0x17] = 7;
    break;
  default:
    return 6;
  }
  uVar8 = (ulong)ref_cell->type;
  if (0xf < uVar8) {
    return 6;
  }
  iVar1 = *(int *)(&DAT_00221280 + uVar8 * 4);
  ref_cell->face_per = iVar1;
  ref_cell->f2n = (REF_INT *)0x0;
  if (uVar8 - 3 < 0xd) {
    pRVar4 = (REF_INT *)malloc((ulong)(uint)(iVar1 << 2) << 2);
    ref_cell->f2n = pRVar4;
    if (pRVar4 == (REF_INT *)0x0) {
      pcVar7 = "malloc ref_cell->f2n of REF_INT NULL";
      uVar5 = 0x132;
      goto LAB_00190e32;
    }
  }
  switch(uVar8) {
  case 0:
  case 1:
  case 2:
    break;
  case 3:
  case 4:
  case 5:
    pRVar4 = ref_cell->f2n;
    RVar9 = 0;
    goto LAB_00191029;
  case 6:
  case 7:
    pRVar4 = ref_cell->f2n;
    RVar9 = 3;
LAB_00191029:
    *pRVar4 = 0;
    pRVar4[1] = 1;
    pRVar4[2] = 2;
    pRVar4[3] = RVar9;
    break;
  case 8:
  case 0xc:
    pRVar4 = ref_cell->f2n;
    pRVar4[0] = 1;
    pRVar4[1] = 3;
    pRVar4[2] = 2;
    pRVar4[3] = 1;
    pRVar4[4] = 0;
    pRVar4[5] = 2;
    pRVar4[6] = 3;
    pRVar4[7] = 0;
    pRVar4[8] = 0;
    pRVar4[9] = 3;
    pRVar4[10] = 1;
    pRVar4[0xb] = 0;
    pRVar4[0xc] = 0;
    pRVar4[0xd] = 1;
    pRVar4[0xe] = 2;
    pRVar4[0xf] = 0;
    break;
  case 9:
  case 0xd:
    pRVar4 = ref_cell->f2n;
    pRVar4[0] = 0;
    pRVar4[1] = 1;
    pRVar4[2] = 2;
    pRVar4[3] = 0;
    pRVar4[4] = 1;
    pRVar4[5] = 4;
    pRVar4[6] = 2;
    pRVar4[7] = 1;
    pRVar4[8] = 2;
    pRVar4[9] = 4;
    pRVar4[10] = 3;
    pRVar4[0xb] = 2;
    pRVar4[0xc] = 0;
    pRVar4[0xd] = 2;
    pRVar4[0xe] = 3;
    pRVar4[0xf] = 0;
    RVar9 = 0;
    RVar10 = 3;
    RVar11 = 1;
    goto LAB_001910e6;
  case 10:
  case 0xe:
    pRVar4 = ref_cell->f2n;
    pRVar4[0] = 0;
    pRVar4[1] = 3;
    pRVar4[2] = 4;
    pRVar4[3] = 1;
    pRVar4[4] = 1;
    pRVar4[5] = 4;
    pRVar4[6] = 5;
    pRVar4[7] = 2;
    pRVar4[8] = 0;
    pRVar4[9] = 2;
    pRVar4[10] = 5;
    pRVar4[0xb] = 3;
    pRVar4[0xc] = 0;
    pRVar4[0xd] = 1;
    pRVar4[0xe] = 2;
    pRVar4[0xf] = 0;
    RVar9 = 3;
    RVar10 = 5;
    RVar11 = 3;
LAB_001910e6:
    pRVar4[0x10] = RVar9;
    pRVar4[0x11] = RVar10;
    pRVar4[0x12] = 4;
    pRVar4[0x13] = RVar11;
    break;
  case 0xb:
  case 0xf:
    pRVar4 = ref_cell->f2n;
    pRVar4[0] = 0;
    pRVar4[1] = 3;
    pRVar4[2] = 7;
    pRVar4[3] = 4;
    pRVar4[4] = 1;
    pRVar4[5] = 5;
    pRVar4[6] = 6;
    pRVar4[7] = 2;
    pRVar4[8] = 0;
    pRVar4[9] = 4;
    pRVar4[10] = 5;
    pRVar4[0xb] = 1;
    pRVar4[0xc] = 2;
    pRVar4[0xd] = 6;
    pRVar4[0xe] = 7;
    pRVar4[0xf] = 3;
    pRVar4[0x10] = 0;
    pRVar4[0x11] = 1;
    pRVar4[0x12] = 2;
    pRVar4[0x13] = 3;
    pRVar4[0x14] = 4;
    pRVar4[0x15] = 7;
    pRVar4[0x16] = 6;
    pRVar4[0x17] = 5;
    break;
  default:
    goto switchD_00190df9_default;
  }
  RVar6 = 0;
switchD_00190df9_default:
  return RVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_cell_initialize(REF_CELL ref_cell,
                                              REF_CELL_TYPE type) {
  ref_cell_type(ref_cell) = type;

  ref_cell_last_node_is_an_id(ref_cell) = REF_FALSE;
  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_last_node_is_an_id(ref_cell) = REF_TRUE;
      break;
    case REF_CELL_TET:
    case REF_CELL_PYR:
    case REF_CELL_PRI:
    case REF_CELL_HEX:
    case REF_CELL_TE2:
    case REF_CELL_PY2:
    case REF_CELL_PR2:
    case REF_CELL_HE2:
      ref_cell_last_node_is_an_id(ref_cell) = REF_FALSE;
      break;
    default:
      return REF_IMPLEMENT;
  }

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
      ref_cell_node_per(ref_cell) = 2;
      break;
    case REF_CELL_ED2:
      ref_cell_node_per(ref_cell) = 3;
      break;
    case REF_CELL_ED3:
      ref_cell_node_per(ref_cell) = 4;
      break;
    case REF_CELL_TRI:
      ref_cell_node_per(ref_cell) = 3;
      break;
    case REF_CELL_TR2:
      ref_cell_node_per(ref_cell) = 6;
      break;
    case REF_CELL_TR3:
      ref_cell_node_per(ref_cell) = 10;
      break;
    case REF_CELL_QUA:
      ref_cell_node_per(ref_cell) = 4;
      break;
    case REF_CELL_QU2:
      ref_cell_node_per(ref_cell) = 9;
      break;
    case REF_CELL_TET:
      ref_cell_node_per(ref_cell) = 4;
      break;
    case REF_CELL_PYR:
      ref_cell_node_per(ref_cell) = 5;
      break;
    case REF_CELL_PRI:
      ref_cell_node_per(ref_cell) = 6;
      break;
    case REF_CELL_HEX:
      ref_cell_node_per(ref_cell) = 8;
      break;
    case REF_CELL_TE2:
      ref_cell_node_per(ref_cell) = 10;
      break;
    case REF_CELL_PY2:
      ref_cell_node_per(ref_cell) = 14;
      break;
    case REF_CELL_PR2:
      ref_cell_node_per(ref_cell) = 18;
      break;
    case REF_CELL_HE2:
      ref_cell_node_per(ref_cell) = 27;
      break;
    default:
      return REF_IMPLEMENT;
  }

  ref_cell_size_per(ref_cell) = ref_cell_node_per(ref_cell) +
                                (ref_cell_last_node_is_an_id(ref_cell) ? 1 : 0);

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      ref_cell_edge_per(ref_cell) = 1;
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_edge_per(ref_cell) = 3;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_edge_per(ref_cell) = 4;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_edge_per(ref_cell) = 6;
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_edge_per(ref_cell) = 8;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_edge_per(ref_cell) = 9;
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_edge_per(ref_cell) = 12;
      break;
    default:
      ref_cell_edge_per(ref_cell) = 0;
      break;
  }

  ref_cell->e2n = NULL;
  if (ref_cell_edge_per(ref_cell) > 0)
    ref_malloc(ref_cell->e2n, 2 * ref_cell_edge_per(ref_cell), REF_INT);

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 0;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 0;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 3;
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 6) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 6) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 7) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 7) = 4;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 6) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 6) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 7) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 7) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 8) = 4;
      ref_cell_e2n_gen(ref_cell, 1, 8) = 5;
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 6) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 6) = 6;
      ref_cell_e2n_gen(ref_cell, 0, 7) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 7) = 7;
      ref_cell_e2n_gen(ref_cell, 0, 8) = 4;
      ref_cell_e2n_gen(ref_cell, 1, 8) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 9) = 4;
      ref_cell_e2n_gen(ref_cell, 1, 9) = 7;
      ref_cell_e2n_gen(ref_cell, 0, 10) = 5;
      ref_cell_e2n_gen(ref_cell, 1, 10) = 6;
      ref_cell_e2n_gen(ref_cell, 0, 11) = 6;
      ref_cell_e2n_gen(ref_cell, 1, 11) = 7;
      break;
    default:
      return REF_IMPLEMENT;
  }

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      ref_cell_face_per(ref_cell) = 0;
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_face_per(ref_cell) = 1;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_face_per(ref_cell) = 1;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_face_per(ref_cell) = 4;
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_face_per(ref_cell) = 5;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_face_per(ref_cell) = 5;
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_face_per(ref_cell) = 6;
      break;
    default:
      return REF_IMPLEMENT;
  }

  ref_cell->f2n = NULL;
  if (ref_cell_face_per(ref_cell) > 0)
    ref_malloc(ref_cell->f2n, 4 * ref_cell_face_per(ref_cell), REF_INT);

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 0;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 3;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = ref_cell_f2n_gen(ref_cell, 0, 0);
      ref_cell_f2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 3;
      ref_cell_f2n_gen(ref_cell, 3, 1) = ref_cell_f2n_gen(ref_cell, 0, 1);
      ref_cell_f2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 1;
      ref_cell_f2n_gen(ref_cell, 3, 2) = ref_cell_f2n_gen(ref_cell, 0, 2);
      ref_cell_f2n_gen(ref_cell, 0, 3) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 3) = ref_cell_f2n_gen(ref_cell, 0, 3);
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = ref_cell_f2n_gen(ref_cell, 0, 0);
      ref_cell_f2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 1) = ref_cell_f2n_gen(ref_cell, 0, 1);
      ref_cell_f2n_gen(ref_cell, 0, 2) = 2;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 3;
      ref_cell_f2n_gen(ref_cell, 3, 2) = ref_cell_f2n_gen(ref_cell, 0, 2);
      ref_cell_f2n_gen(ref_cell, 0, 3) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 3;
      ref_cell_f2n_gen(ref_cell, 3, 3) = ref_cell_f2n_gen(ref_cell, 0, 3);
      ref_cell_f2n_gen(ref_cell, 0, 4) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 4) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 4) = 4;
      ref_cell_f2n_gen(ref_cell, 3, 4) = 1;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 4;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 1;

      ref_cell_f2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 5;
      ref_cell_f2n_gen(ref_cell, 3, 1) = 2;

      ref_cell_f2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 2;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 5;
      ref_cell_f2n_gen(ref_cell, 3, 2) = 3;

      ref_cell_f2n_gen(ref_cell, 0, 3) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 3) = ref_cell_f2n_gen(ref_cell, 0, 3);

      ref_cell_f2n_gen(ref_cell, 0, 4) = 3;
      ref_cell_f2n_gen(ref_cell, 1, 4) = 5;
      ref_cell_f2n_gen(ref_cell, 2, 4) = 4;
      ref_cell_f2n_gen(ref_cell, 3, 4) = ref_cell_f2n_gen(ref_cell, 0, 4);
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 7;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 4;

      ref_cell_f2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 5;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 6;
      ref_cell_f2n_gen(ref_cell, 3, 1) = 2;

      ref_cell_f2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 5;
      ref_cell_f2n_gen(ref_cell, 3, 2) = 1;

      ref_cell_f2n_gen(ref_cell, 0, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 6;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 7;
      ref_cell_f2n_gen(ref_cell, 3, 3) = 3;

      ref_cell_f2n_gen(ref_cell, 0, 4) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 4) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 4) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 4) = 3;

      ref_cell_f2n_gen(ref_cell, 0, 5) = 4;
      ref_cell_f2n_gen(ref_cell, 1, 5) = 7;
      ref_cell_f2n_gen(ref_cell, 2, 5) = 6;
      ref_cell_f2n_gen(ref_cell, 3, 5) = 5;
      break;
    default:
      return REF_IMPLEMENT;
  }

  return REF_SUCCESS;
}